

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_graph_manager.hpp
# Opt level: O2

void __thiscall
duckdb::QueryGraphManager::QueryGraphManager(QueryGraphManager *this,ClientContext *context)

{
  RelationManager::RelationManager(&this->relation_manager,context);
  (this->set_manager).root.relation.
  super_unique_ptr<duckdb::JoinRelationSet,_std::default_delete<duckdb::JoinRelationSet>_>._M_t.
  super___uniq_ptr_impl<duckdb::JoinRelationSet,_std::default_delete<duckdb::JoinRelationSet>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::JoinRelationSet_*,_std::default_delete<duckdb::JoinRelationSet>_>
       = (_Tuple_impl<0UL,_duckdb::JoinRelationSet_*,_std::default_delete<duckdb::JoinRelationSet>_>
         )0x0;
  (this->set_manager).root.children._M_h._M_buckets =
       &(this->set_manager).root.children._M_h._M_single_bucket;
  (this->set_manager).root.children._M_h._M_bucket_count = 1;
  (this->set_manager).root.children._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->set_manager).root.children._M_h._M_element_count = 0;
  (this->set_manager).root.children._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->set_manager).root.children._M_h._M_rehash_policy._M_next_resize = 0;
  (this->set_manager).root.children._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->context = context;
  (this->plans).ptr =
       (unordered_map<std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>,_duckdb::ReferenceHashFunction<duckdb::JoinRelationSet>,_duckdb::ReferenceEquality<duckdb::JoinRelationSet>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>_>_>
        *)0x0;
  (this->filter_operators).
  super_vector<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->filter_operators).
  super_vector<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->filter_operators).
  super_vector<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->filters_and_bindings).
  super_vector<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->filters_and_bindings).
  super_vector<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->filters_and_bindings).
  super_vector<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->query_graph).root.neighbors.
  super_vector<duckdb::unique_ptr<duckdb::NeighborInfo,_std::default_delete<duckdb::NeighborInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::NeighborInfo,_std::default_delete<duckdb::NeighborInfo>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::NeighborInfo,_std::default_delete<duckdb::NeighborInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::NeighborInfo,_std::default_delete<duckdb::NeighborInfo>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->query_graph).root.neighbors.
           super_vector<duckdb::unique_ptr<duckdb::NeighborInfo,_std::default_delete<duckdb::NeighborInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::NeighborInfo,_std::default_delete<duckdb::NeighborInfo>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::NeighborInfo,_std::default_delete<duckdb::NeighborInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::NeighborInfo,_std::default_delete<duckdb::NeighborInfo>,_true>_>_>
           ._M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->query_graph).root.neighbors.
           super_vector<duckdb::unique_ptr<duckdb::NeighborInfo,_std::default_delete<duckdb::NeighborInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::NeighborInfo,_std::default_delete<duckdb::NeighborInfo>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::NeighborInfo,_std::default_delete<duckdb::NeighborInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::NeighborInfo,_std::default_delete<duckdb::NeighborInfo>,_true>_>_>
           ._M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->query_graph).root.children._M_h._M_buckets =
       &(this->query_graph).root.children._M_h._M_single_bucket;
  (this->query_graph).root.children._M_h._M_bucket_count = 1;
  (this->query_graph).root.children._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->query_graph).root.children._M_h._M_element_count = 0;
  (this->query_graph).root.children._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->query_graph).root.children._M_h._M_rehash_policy._M_next_resize = 0;
  (this->query_graph).root.children._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

explicit QueryGraphManager(ClientContext &context) : relation_manager(context), context(context) {
	}